

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

int AF_AActor_CheckSight
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *t1;
  AActor *t2;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0044f03b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0044f022:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0044f03b:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x391,
                  "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  t1 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_0044ef50;
    bVar1 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0044f03b;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_0044f022;
LAB_0044ef50:
    t1 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0044f05a;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0044f02b:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0044f05a;
  }
  t2 = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (t2 == (AActor *)0x0) goto LAB_0044ef86;
LAB_0044ef9b:
    bVar1 = DObject::IsKindOf((DObject *)t2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0044f05a:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                    ,0x392,
                    "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (t2 != (AActor *)0x0) goto LAB_0044f02b;
LAB_0044ef86:
    NullParam("\"target\"");
    t2 = (AActor *)param[1].field_0.field_1.a;
    if (t2 != (AActor *)0x0) goto LAB_0044ef9b;
    t2 = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type == '\0') goto LAB_0044efe8;
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
LAB_0044efe8:
      bVar1 = P_CheckSight(t1,t2,param[2].field_0.i);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                        ,0x394,
                        "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar1);
        iVar2 = 1;
      }
      return iVar2;
    }
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                ,0x393,
                "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSight)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(target, AActor);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_BOOL(P_CheckSight(self, target, flags));
}